

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O3

void __thiscall
simplex_tree_serialization_exception<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
::test_method(simplex_tree_serialization_exception<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
              *this)

{
  long lVar1;
  long lVar2;
  char *buffer;
  ostream *poVar3;
  size_t idx;
  long lVar4;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> st;
  shared_count asStack_160 [7];
  char *local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> local_b8;
  
  buffer = (char *)operator_new__(0x100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"Serialization of a too long buffer:\n",0x24);
  lVar4 = 0;
  do {
    lVar1 = *(long *)(std::clog + -0x18);
    if ((&DAT_0019f109)[lVar1] == '\0') {
      std::ios::widen((char)lVar1 + '(');
      (&DAT_0019f109)[lVar1] = 1;
    }
    lVar2 = std::clog;
    std::__cxx11::string::push_back[lVar1] = (code)0x30;
    *(undefined8 *)(std::__throw_bad_alloc + *(long *)(lVar2 + -0x18)) = 2;
    *(uint *)(boost::unit_test::unit_test_log_t::instance + *(long *)(lVar2 + -0x18)) =
         *(uint *)(boost::unit_test::unit_test_log_t::instance + *(long *)(lVar2 + -0x18)) | 0x4000;
    *(uint *)(boost::unit_test::unit_test_log_t::instance + *(long *)(lVar2 + -0x18)) =
         *(uint *)(boost::unit_test::unit_test_log_t::instance + *(long *)(lVar2 + -0x18)) &
         0xffffffb5 | 8;
    poVar3 = (ostream *)std::ostream::operator<<(&std::clog,(uint)(byte)buffer[lVar4]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_b8.nodes_label_to_list_._M_h._M_buckets =
       &local_b8.nodes_label_to_list_._M_h._M_single_bucket;
  local_b8.nodes_label_to_list_._M_h._M_bucket_count = 1;
  local_b8.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8.nodes_label_to_list_._M_h._M_element_count = 0;
  local_b8.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b8.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b8.null_vertex_ = -1;
  local_b8.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>_>
        *)0x0;
  local_b8.root_.parent_ = -1;
  local_b8.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  local_b8.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  local_b8.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  local_b8.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.dimension_ = -1;
  local_b8.dimension_to_be_lowered_ = false;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x101);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::serialize
            (&local_b8,buffer,0x100);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x101);
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_001985d8;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "exception std::invalid_argument expected but not raised";
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_160);
  operator_delete__(buffer);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::~Simplex_tree
            (&local_b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_serialization_exception, Stree, list_of_tested_variants) {
  const std::size_t too_long_buffer_size = 256;
  char* buffer = new char[too_long_buffer_size];

  std::clog << "Serialization of a too long buffer:\n";
  for (std::size_t idx = 0; idx < too_long_buffer_size; idx++) {
    std::clog << std::setfill('0') 
              << std::setw(2) 
              << std::uppercase 
              << std::hex << (0xFF & buffer[idx]) << " " << std::dec;
  }
  std::clog << std::endl;
  Stree st;
  BOOST_CHECK_THROW(st.serialize(buffer, too_long_buffer_size), std::invalid_argument);
  delete[] buffer;
}